

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O1

MPP_RET mpp_enc_refs_set_rc_igop(MppEncRefs refs,RK_S32 igop)

{
  MPP_RET MVar1;
  
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_set_rc_igop");
    MVar1 = MPP_ERR_VALUE;
  }
  else {
    if (((byte)enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_set_rc_igop",refs);
    }
    if (*(int *)((long)refs + 0x30) != igop) {
      *(RK_S32 *)((long)refs + 0x30) = igop;
      *(byte *)refs = *refs | 4;
    }
    MVar1 = MPP_OK;
    if (((byte)enc_refs_debug & 1) != 0) {
      MVar1 = MPP_OK;
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_set_rc_igop",refs);
    }
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_enc_refs_set_rc_igop(MppEncRefs refs, RK_S32 igop)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;

    if (p->igop != igop) {
        p->igop = igop;
        p->changed |= ENC_REFS_IGOP_CHANGED;
    }

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}